

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O0

char * ValidateArrayContents<aiVector3t<float>>
                 (aiVector3D *arr,uint size,vector<bool,_std::allocator<bool>_> *dirtyMask,
                 bool mayBeIdentical,bool mayBeZero)

{
  bool bVar1;
  const_reference cVar2;
  bool bVar3;
  size_type sVar4;
  aiVector3t<float> *this;
  aiVector3D *v;
  uint local_30;
  uint i;
  uint cnt;
  bool b;
  bool mayBeZero_local;
  bool mayBeIdentical_local;
  vector<bool,_std::allocator<bool>_> *dirtyMask_local;
  uint size_local;
  aiVector3D *arr_local;
  
  bVar1 = false;
  local_30 = 0;
  v._4_4_ = 0;
  do {
    if (size <= v._4_4_) {
      if (((local_30 < 2) || (bVar1)) || (mayBeIdentical)) {
        arr_local = (aiVector3D *)0x0;
      }
      else {
        arr_local = (aiVector3D *)anon_var_dwarf_353452;
      }
      return (char *)arr_local;
    }
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(dirtyMask);
    if ((sVar4 == 0) ||
       (cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](dirtyMask,(ulong)v._4_4_),
       !cVar2)) {
      local_30 = local_30 + 1;
      this = arr + v._4_4_;
      bVar3 = is_special_float(this->x);
      if ((bVar3) ||
         ((bVar3 = is_special_float(this->y), bVar3 || (bVar3 = is_special_float(this->z), bVar3))))
      {
        arr_local = (aiVector3D *)anon_var_dwarf_353426;
        return (char *)arr_local;
      }
      if (((((!mayBeZero) && (this->x == 0.0)) && (!NAN(this->x))) &&
          ((this->y == 0.0 && (!NAN(this->y))))) && ((this->z == 0.0 && (!NAN(this->z))))) {
        arr_local = (aiVector3D *)anon_var_dwarf_35343c;
        return (char *)arr_local;
      }
      if ((v._4_4_ != 0) && (bVar3 = aiVector3t<float>::operator!=(this,arr + (v._4_4_ - 1)), bVar3)
         ) {
        bVar1 = true;
      }
    }
    v._4_4_ = v._4_4_ + 1;
  } while( true );
}

Assistant:

inline
const char* ValidateArrayContents<aiVector3D>(const aiVector3D* arr, unsigned int size,
        const std::vector<bool>& dirtyMask, bool mayBeIdentical , bool mayBeZero ) {
    bool b = false;
    unsigned int cnt = 0;
    for (unsigned int i = 0; i < size;++i)  {

        if (dirtyMask.size() && dirtyMask[i]) {
            continue;
        }
        ++cnt;

        const aiVector3D& v = arr[i];
        if (is_special_float(v.x) || is_special_float(v.y) || is_special_float(v.z))    {
            return "INF/NAN was found in a vector component";
        }
        if (!mayBeZero && !v.x && !v.y && !v.z )    {
            return "Found zero-length vector";
        }
        if (i && v != arr[i-1])b = true;
    }
    if (cnt > 1 && !b && !mayBeIdentical) {
        return "All vectors are identical";
    }
    return nullptr;
}